

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O2

void __thiscall Assimp::ColladaLoader::~ColladaLoader(ColladaLoader *this)

{
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_0072b568;
  std::_Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>::~_Vector_base
            (&(this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>);
  std::_Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>::~_Vector_base
            (&(this->mTextures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>);
  std::_Vector_base<aiLight_*,_std::allocator<aiLight_*>_>::~_Vector_base
            (&(this->mLights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>);
  std::_Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>::~_Vector_base
            (&(this->mCameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>);
  std::
  _Vector_base<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
  ::~_Vector_base(&(this->newMats).
                   super__Vector_base<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
                 );
  std::_Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>::~_Vector_base
            (&(this->mTargetMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>);
  std::_Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>::~_Vector_base
            (&(this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&(this->mMaterialIndexByName)._M_t);
  std::
  _Rb_tree<Assimp::ColladaMeshIndex,_std::pair<const_Assimp::ColladaMeshIndex,_unsigned_long>,_std::_Select1st<std::pair<const_Assimp::ColladaMeshIndex,_unsigned_long>_>,_std::less<Assimp::ColladaMeshIndex>,_std::allocator<std::pair<const_Assimp::ColladaMeshIndex,_unsigned_long>_>_>
  ::~_Rb_tree(&(this->mMeshIndexByID)._M_t);
  std::__cxx11::string::~string((string *)&this->mFileName);
  BaseImporter::~BaseImporter(&this->super_BaseImporter);
  return;
}

Assistant:

ColladaLoader::~ColladaLoader() {
    // empty
}